

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

MeshAttributeCornerTable * __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
GetAttributeCornerTable
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          int att_id)

{
  pointer pAVar1;
  pointer puVar2;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  do {
    uVar7 = (ulong)uVar6;
    pAVar1 = (this->attribute_data_).
             super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x140) <= uVar7)
    {
      return (MeshAttributeCornerTable *)0x0;
    }
    iVar5 = pAVar1[uVar7].decoder_id;
    if ((-1 < (long)iVar5) &&
       (puVar2 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.attributes_decoders_.
                 super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       iVar5 < (int)((ulong)((long)(this->decoder_->super_MeshDecoder).super_PointCloudDecoder.
                                   attributes_decoders_.
                                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 3))
       ) {
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
      .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
           puVar2[iVar5]._M_t.
           super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
           ._M_t;
      iVar5 = 0;
      while (iVar4 = (**(code **)(*(long *)_Var3._M_t.
                                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                           .
                                           super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                           ._M_head_impl + 0x30))
                               (_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                                _M_head_impl), iVar5 < iVar4) {
        iVar4 = (**(code **)(*(long *)_Var3._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      .
                                      super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                      ._M_head_impl + 0x28))
                          (_Var3._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                           _M_head_impl,iVar5);
        iVar5 = iVar5 + 1;
        if (iVar4 == att_id) {
          pAVar1 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pAVar1[uVar7].is_connectivity_used == false) {
            return (MeshAttributeCornerTable *)0x0;
          }
          return &pAVar1[uVar7].connectivity_data;
        }
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

const MeshAttributeCornerTable *
MeshEdgebreakerDecoderImpl<TraversalDecoder>::GetAttributeCornerTable(
    int att_id) const {
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    const int decoder_id = attribute_data_[i].decoder_id;
    if (decoder_id < 0 || decoder_id >= decoder_->num_attributes_decoders()) {
      continue;
    }
    const AttributesDecoderInterface *const dec =
        decoder_->attributes_decoder(decoder_id);
    for (int j = 0; j < dec->GetNumAttributes(); ++j) {
      if (dec->GetAttributeId(j) == att_id) {
        if (attribute_data_[i].is_connectivity_used) {
          return &attribute_data_[i].connectivity_data;
        }
        return nullptr;
      }
    }
  }
  return nullptr;
}